

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O2

float r_imag(complex *z)

{
  return z->i;
}

Assistant:

float
r_imag(z)
complex *z;
#else
float
r_imag(complex * z)
#endif
{
    return (z->i);
}


#define log10e 0.43429448190325182765

#ifdef KR_headers
double log();
float
r_lg10(x)
real *x;
#else
#undef abs

float
r_lg10(real * x)
#endif
{
    return (log10e * log(*x));
}


#ifdef KR_headers
float
r_sign(a, b)
real *a, *b;
#else
float
r_sign(real * a, real * b)
#endif
{
    float x;
    x = (*a >= 0 ? *a : -*a);
    return (*b >= 0 ? x : -x);
}


#ifdef KR_headers
double floor();
integer
i_dnnt(x)
real *x;
#else
#undef abs

integer
i_dnnt(real * x)
#endif
{
    return ((*x) >= 0 ? floor(*x + .5) : -floor(.5 - *x));
}


#ifdef KR_headers
double pow();
double
pow_dd(ap, bp)
doublereal *ap, *bp;
#else
#undef abs

double
pow_dd(doublereal * ap, doublereal * bp)
#endif
{
    return (pow(*ap, *bp));
}


#ifdef KR_headers
float
pow_ri(ap, bp)
real *ap;
integer *bp;
#else
float
pow_ri(real * ap, integer * bp)
#endif
{
    float pow, x;
    integer n;
    unsigned long u;

    pow = 1;
    x = *ap;
    n = *bp;

    if (n != 0) {
        if (n < 0) {
            n = -n;
            x = 1 / x;
        }
        for (u = n;;) {
            if (u & 01)
                pow *= x;
            if (u >>= 1)
                x *= x;
            else
                break;
        }
    }